

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O3

uint __thiscall
ON_MeshFaceList::GetVertexIndexInterval
          (ON_MeshFaceList *this,uint minimum_valid_vertex_index,uint maximum_valid_vertex_index,
          uint *minimum_vertex_index,uint *maximum_vertex_index)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  
  uVar4 = 0;
  if (((this->m_face_count == 0) || (uVar2 = this->m_face_stride, uVar2 < 3)) ||
     (puVar8 = this->m_faces, puVar8 == (uint *)0x0)) {
    uVar7 = 0;
    uVar9 = 0;
  }
  else {
    uVar5 = this->m_face_count * uVar2;
    uVar7 = 0;
    uVar9 = 0;
    uVar4 = 0;
    if (uVar5 != 0) {
      puVar1 = puVar8 + uVar5;
      uVar9 = 0;
      uVar7 = 0;
      uVar4 = 0;
      do {
        uVar5 = *puVar8;
        uVar6 = puVar8[1];
        uVar3 = uVar5;
        if (uVar6 >= uVar5 && uVar6 != uVar5) {
          uVar3 = uVar6;
        }
        if (uVar6 < uVar5) {
          uVar5 = uVar6;
        }
        uVar6 = puVar8[2];
        uVar10 = uVar3;
        if (uVar3 < uVar6) {
          uVar10 = uVar6;
        }
        if (uVar6 < uVar5) {
          uVar5 = uVar6;
          uVar10 = uVar3;
        }
        lVar11 = 0xc;
        uVar6 = uVar5;
        if (this->m_bQuadFaces != false) {
          uVar3 = puVar8[3];
          lVar11 = 0x10;
          uVar6 = uVar3;
          if ((uVar5 <= uVar3) && (uVar6 = uVar5, uVar10 < uVar3)) {
            uVar10 = uVar3;
          }
        }
        if ((uVar10 <= maximum_valid_vertex_index) && (minimum_valid_vertex_index <= uVar6)) {
          if (uVar6 < uVar9) {
            uVar9 = uVar6;
          }
          if (uVar7 < uVar10) {
            uVar7 = uVar10;
          }
          if (uVar4 == 0) {
            uVar9 = uVar6;
            uVar7 = uVar10;
          }
          uVar4 = uVar4 + 1;
        }
        puVar8 = (uint *)((long)puVar8 +
                         (ulong)((this->m_bQuadFaces ^ 0xfffffffd) + uVar2) * 4 + lVar11);
      } while (puVar8 < puVar1);
    }
  }
  if (minimum_vertex_index != (uint *)0x0) {
    *minimum_vertex_index = uVar9;
  }
  if (maximum_vertex_index != (uint *)0x0) {
    *maximum_vertex_index = uVar7;
  }
  return uVar4;
}

Assistant:

unsigned int ON_MeshFaceList::GetVertexIndexInterval(
  unsigned int minimum_valid_vertex_index,
  unsigned int maximum_valid_vertex_index,
  unsigned int* minimum_vertex_index,
  unsigned int* maximum_vertex_index
  ) const
{
  unsigned int vertex0 = 0;
  unsigned int vertex1 = 0;
  unsigned int v0, v1, vi;
  unsigned int valid_face_count = 0;
  for (;;)
  {
    if (0 == m_face_count || m_face_stride < 3 || nullptr == m_faces)
      break;
    const unsigned int face_vertex_count = m_bQuadFaces ? 4 : 3;
    const unsigned int delta_f = m_face_stride - face_vertex_count;
    const unsigned int* f1 = m_faces + (m_face_count*m_face_stride);
    for (const unsigned int* f = m_faces; f < f1; f += delta_f)
    {
      v0 = v1 = *f++;
      vi = *f++;
      if (vi < v0) v0 = vi; else if (vi > v1) v1 = vi;
      vi = *f++;
      if (vi < v0) v0 = vi; else if (vi > v1) v1 = vi;
      if (m_bQuadFaces)
      {
        vi = *f++;
        if (vi < v0) v0 = vi; else if (vi > v1) v1 = vi;
      }
      if (v0 < minimum_valid_vertex_index || v1 > maximum_valid_vertex_index)
        continue;
      if (0 == valid_face_count)
      {
        vertex0 = v0;
        vertex1 = v1;
      }
      else
      {
        if (v0 < vertex0)
          vertex0 = v0;
        if (v1 > vertex1)
          vertex1 = v1;
      }
      valid_face_count++;
    }
    break;
  }
  if (minimum_vertex_index)
    *minimum_vertex_index = vertex0;
  if (maximum_vertex_index)
    *maximum_vertex_index = vertex1;
  return valid_face_count;
}